

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Serializer::CloseStream
          (BP3Serializer *this,IO *io,size_t *metadataStart,size_t *metadataCount,bool addMetadata)

{
  _func_int **pp_Var1;
  long lVar2;
  _func_int *p_Var3;
  mapped_type *pmVar4;
  allocator local_99;
  size_t *local_98;
  key_type local_90;
  string local_70;
  string local_50;
  
  p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  local_98 = metadataCount;
  std::__cxx11::string::string((string *)&local_50,"buffering",(allocator *)&local_90);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var3),&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  if ((&(this->super_BP3Base).field_0x1c0)[(long)p_Var3] == '\x01') {
    SerializeDataBuffer(this,io);
    p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  }
  *metadataStart = *(size_t *)(&(this->super_BP3Base).field_0x60 + (long)p_Var3);
  SerializeMetadataInData(this,false,addMetadata);
  pp_Var1 = (this->super_BP3Base)._vptr_BP3Base;
  *local_98 = *(long *)(&(this->super_BP3Base).field_0x60 + (long)pp_Var1[-3]) - *metadataStart;
  p_Var3 = pp_Var1[-3];
  if ((&(this->super_BP3Base).field_0x2e8)[(long)p_Var3] == '\x01') {
    lVar2 = *(long *)(&(this->super_BP3Base).field_0x60 + (long)p_Var3);
    std::__cxx11::string::string((string *)&local_90,"buffering",&local_99);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)(&(this->super_BP3Base).field_0x2b0 + (long)p_Var3),&local_90);
    *pmVar4 = *pmVar4 + lVar2;
    std::__cxx11::string::~string((string *)&local_90);
    p_Var3 = (this->super_BP3Base)._vptr_BP3Base[-3];
  }
  std::__cxx11::string::string((string *)&local_70,"buffering",(allocator *)&local_90);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP3Base).field_0x278 + (long)p_Var3),&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void BP3Serializer::CloseStream(core::IO &io, size_t &metadataStart, size_t &metadataCount,
                                const bool addMetadata)
{

    m_Profiler.Start("buffering");
    if (m_MetadataSet.DataPGIsOpen)
    {
        SerializeDataBuffer(io);
    }

    metadataStart = m_Data.m_Position;

    SerializeMetadataInData(false, addMetadata);

    metadataCount = m_Data.m_Position - metadataStart;

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.at("buffering") += m_Data.m_Position;
    }
    m_Profiler.Stop("buffering");
}